

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ublox.c
# Opt level: O0

slReturn rcvUbxMsg(int fdPort,ubxMsg *msg,int max_ms)

{
  errInfo error;
  errInfo error_00;
  errInfo error_01;
  errInfo error_02;
  errInfo error_03;
  errInfo error_04;
  ubxMsg msg_00;
  undefined8 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined6 uVar4;
  size_t max;
  undefined4 uVar5;
  _Bool _Var6;
  longlong lVar7;
  long lVar8;
  void *pvVar9;
  long lVar10;
  slReturn pvVar11;
  slBuffer *psVar12;
  byte *buffer;
  undefined8 in_stack_fffffffffffffdd0;
  errorInfo_slReturn local_160;
  errorInfo_slReturn local_140;
  errorInfo_slReturn local_120;
  ubxChecksum local_fa;
  errorInfo_slReturn local_f8;
  size_t local_d8;
  size_t length;
  char *local_c8;
  char *local_c0;
  uint32_t local_b8;
  undefined4 uStack_b4;
  ubxType local_aa;
  undefined1 auStack_a8 [6];
  ubxType type;
  char *local_a0;
  char *local_98;
  undefined8 local_90;
  slReturn rubResp;
  undefined1 auStack_78 [2];
  byte buff [2];
  int c;
  char *local_70;
  char *local_68;
  undefined8 local_60;
  slReturn rscResp;
  longlong lStack_48;
  int count;
  longlong startTime;
  ubxMsg nomsg;
  int max_ms_local;
  ubxMsg *msg_local;
  int fdPort_local;
  
  nomsg._20_4_ = max_ms;
  memset(&startTime,0,0x18);
  *(longlong *)msg = startTime;
  msg->body = (slBuffer *)nomsg._0_8_;
  *(slBuffer **)&msg->checksum = nomsg.body;
  lStack_48 = currentTimeMs();
  do {
    lVar7 = currentTimeMs();
    if ((long)(int)nomsg._20_4_ <= lVar7 - lStack_48) {
      createErrorInfo(&local_160,
                      "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/ublox.c"
                      ,"rcvUbxMsg",0xd3,(slReturn)0x0);
      error_04.fileName = local_160.fileName;
      error_04.cause = local_160.cause;
      error_04.functionName = local_160.functionName;
      error_04.lineNumber = local_160.lineNumber;
      error_04._28_4_ = local_160._28_4_;
      pvVar11 = makeErrorMsgReturn(error_04,"timed out while waiting to receive UBX message");
      return pvVar11;
    }
    rscResp._4_4_ = 0;
    while (lVar7 = currentTimeMs(), lVar7 - lStack_48 < (long)(int)nomsg._20_4_ && rscResp._4_4_ < 2
          ) {
      lVar8 = lStack_48 + (int)nomsg._20_4_;
      lVar7 = currentTimeMs();
      pvVar11 = readSerialChar(fdPort,lVar8 - lVar7);
      _Var6 = isErrorReturn(pvVar11);
      if (_Var6) {
        createErrorInfo((errorInfo_slReturn *)auStack_78,
                        "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/ublox.c"
                        ,"rcvUbxMsg",0x95,pvVar11);
        error.fileName = local_70;
        error.cause = _auStack_78;
        error.functionName = local_68;
        error._24_8_ = local_60;
        pvVar11 = makeErrorMsgReturn(error,"couldn\'t read serial character");
        return pvVar11;
      }
      _Var6 = isWarningReturn(pvVar11);
      if (_Var6) break;
      pvVar9 = getReturnInfo(pvVar11);
      rubResp._4_4_ = (int)(char)pvVar9;
      if (-1 < rubResp._4_4_) {
        if ((rscResp._4_4_ == 0) && (rubResp._4_4_ == 0xb5)) {
          rscResp._4_4_ = 1;
        }
        else if ((rscResp._4_4_ == 1) && (rubResp._4_4_ == 0x62)) {
          rscResp._4_4_ = 2;
        }
        else {
          rscResp._4_4_ = 0;
        }
      }
    }
    uVar5 = nomsg._20_4_;
    lVar8 = lStack_48;
    if (1 < rscResp._4_4_) {
      lVar10 = lStack_48 + (int)nomsg._20_4_;
      lVar7 = currentTimeMs();
      pvVar11 = readUbxBytes(fdPort,(byte *)((long)&rubResp + 2),(int *)((long)&rscResp + 4),2,uVar5
                             ,lVar8,lVar10 - lVar7);
      _Var6 = isErrorReturn(pvVar11);
      uVar5 = nomsg._20_4_;
      lVar8 = lStack_48;
      if (_Var6) {
        createErrorInfo((errorInfo_slReturn *)auStack_a8,
                        "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/ublox.c"
                        ,"rcvUbxMsg",0xad,pvVar11);
        error_00.fileName = local_a0;
        error_00.cause = _auStack_a8;
        error_00.functionName = local_98;
        error_00._24_8_ = local_90;
        pvVar11 = makeErrorMsgReturn(error_00,
                                     "couldn\'t read serial characters while receiving UBX message type"
                                    );
        return pvVar11;
      }
      if (1 < rscResp._4_4_) {
        local_aa = rubResp._2_2_;
        msg->type = rubResp._2_2_;
        lVar10 = lStack_48 + (int)nomsg._20_4_;
        lVar7 = currentTimeMs();
        pvVar11 = readUbxBytes(fdPort,(byte *)((long)&rubResp + 2),(int *)((long)&rscResp + 4),2,
                               uVar5,lVar8,lVar10 - lVar7);
        _Var6 = isErrorReturn(pvVar11);
        if (_Var6) {
          createErrorInfo((errorInfo_slReturn *)&length,
                          "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/ublox.c"
                          ,"rcvUbxMsg",0xb5,pvVar11);
          error_01.fileName = local_c8;
          error_01.cause = (slReturn)length;
          error_01.functionName = local_c0;
          error_01.lineNumber = local_b8;
          error_01._28_4_ = uStack_b4;
          pvVar11 = makeErrorMsgReturn(error_01,
                                       "couldn\'t read serial characters while receiving UBX message body length"
                                      );
          return pvVar11;
        }
        if (1 < rscResp._4_4_) {
          local_d8 = (size_t)(int)(uint)(ushort)rubResp._2_2_;
          psVar12 = create_slBuffer(local_d8,LittleEndian);
          msg->body = psVar12;
          buffer = buffer_slBuffer(msg->body);
          uVar5 = nomsg._20_4_;
          lVar8 = lStack_48;
          max = local_d8;
          lVar10 = lStack_48 + (int)nomsg._20_4_;
          lVar7 = currentTimeMs();
          pvVar11 = readUbxBytes(fdPort,buffer,(int *)((long)&rscResp + 4),max,uVar5,lVar8,
                                 lVar10 - lVar7);
          _Var6 = isErrorReturn(pvVar11);
          if (_Var6) {
            createErrorInfo(&local_f8,
                            "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/ublox.c"
                            ,"rcvUbxMsg",0xbd,pvVar11);
            pvVar11 = makeErrorFmtMsgReturn
                                (0x11e5e1,(char *)(ulong)local_aa.class,(ulong)local_aa.id,local_d8)
            ;
            return pvVar11;
          }
          uVar1 = msg->body;
          uVar2 = (msg->checksum).ck_a;
          uVar3 = (msg->checksum).ck_b;
          msg_00.body._1_1_ = uVar3;
          msg_00.body._0_1_ = uVar2;
          uVar4 = *(undefined6 *)&msg->field_0x12;
          msg_00.body._2_6_ = uVar4;
          msg_00._0_8_ = uVar1;
          msg_00._16_8_ = in_stack_fffffffffffffdd0;
          local_fa = calcFletcherChecksum(msg_00);
          uVar5 = nomsg._20_4_;
          lVar8 = lStack_48;
          msg->checksum = local_fa;
          if (local_d8 <= (ulong)(long)rscResp._4_4_) {
            lVar10 = lStack_48 + (int)nomsg._20_4_;
            lVar7 = currentTimeMs();
            pvVar11 = readUbxBytes(fdPort,(byte *)((long)&rubResp + 2),(int *)((long)&rscResp + 4),2
                                   ,uVar5,lVar8,lVar10 - lVar7);
            _Var6 = isErrorReturn(pvVar11);
            if (_Var6) {
              createErrorInfo(&local_120,
                              "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/ublox.c"
                              ,"rcvUbxMsg",0xc6,pvVar11);
              error_02.fileName = local_120.fileName;
              error_02.cause = local_120.cause;
              error_02.functionName = local_120.functionName;
              error_02.lineNumber = local_120.lineNumber;
              error_02._28_4_ = local_120._28_4_;
              pvVar11 = makeErrorMsgReturn(error_02,
                                           "couldn\'t read serial characters while receiving UBX message checksum"
                                          );
              return pvVar11;
            }
            if (1 < rscResp._4_4_) {
              if ((rubResp._2_1_ == (msg->checksum).ck_a) && (rubResp._3_1_ == (msg->checksum).ck_b)
                 ) {
                pvVar11 = makeOkReturn();
                return pvVar11;
              }
              free(msg->body);
              createErrorInfo(&local_140,
                              "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/ublox.c"
                              ,"rcvUbxMsg",0xcc,(slReturn)0x0);
              error_03.fileName = local_140.fileName;
              error_03.cause = local_140.cause;
              error_03.functionName = local_140.functionName;
              error_03.lineNumber = local_140.lineNumber;
              error_03._28_4_ = local_140._28_4_;
              pvVar11 = makeErrorMsgReturn(error_03,"UBX received message with checksum error");
              return pvVar11;
            }
          }
          free(msg->body);
        }
      }
    }
  } while( true );
}

Assistant:

static slReturn rcvUbxMsg(int fdPort, ubxMsg* msg, int max_ms) {

    ubxMsg nomsg = { {0, 0}, NULL, {0, 0}};
    *msg = nomsg;

    long long startTime = currentTimeMs();

    while (((currentTimeMs() - startTime) < max_ms)) {

        // first we synchronize on the 0xB5, 0x62 byte pair that starts every UBX message...
        int count = 0;
        while (((currentTimeMs() - startTime) < max_ms) && (count < 2)) {
            slReturn rscResp = readSerialChar(fdPort, startTime + max_ms - currentTimeMs());

            if (isErrorReturn(rscResp))
                return makeErrorMsgReturn(ERR_CAUSE(rscResp), "couldn't read serial character");

            if (isWarningReturn(rscResp))
                break;  // if we timed out...

            int c= getReturnInfoChar(rscResp);
            if (c >= 0) {
                if ((count == 0) && (c == UBX_SYNC1)) {
                    count++;
                    continue;
                }
                if ((count == 1) && (c == UBX_SYNC2)) {
                    count++;
                    continue;
                }
                count = 0;
            }
        }
        if (count < 2) continue;

        // we're synchronized, so it's time to get the message type...
        byte buff[2];
        slReturn rubResp = readUbxBytes(fdPort, buff, &count, 2, max_ms, startTime, startTime + max_ms - currentTimeMs());
        if (isErrorReturn(rubResp))
            return makeErrorMsgReturn(ERR_CAUSE(rubResp), "couldn't read serial characters while receiving UBX message type");
        if (count < 2) continue;
        ubxType type = {buff[0], buff[1]};
        msg->type = type;

        // get the body length, little-endian...
        rubResp = readUbxBytes(fdPort, buff, &count, 2, max_ms, startTime, startTime + max_ms - currentTimeMs());
        if (isErrorReturn(rubResp))
            return makeErrorMsgReturn(ERR_CAUSE(rubResp), "couldn't read serial characters while receiving UBX message body length");
        if (count < 2) continue;
        size_t length = buff[0] | (buff[1] << 8);

        // now get the body...
        msg->body = create_slBuffer(length, LittleEndian);
        rubResp = readUbxBytes(fdPort, buffer_slBuffer(msg->body), &count, length, max_ms, startTime, startTime + max_ms - currentTimeMs());
        if (isErrorReturn(rubResp))
            return makeErrorFmtMsgReturn(ERR_CAUSE(rubResp),
                                          "couldn't read serial characters while receiving UBX message body (0x%02x/0x%02x, %d bytes)",
                                          type.class, type.id, length);
        msg->checksum = calcFletcherChecksum(*msg);  // this calculates what the checksum SHOULD be...
        if (count >= length) {

            // finally, get the checksum...
            rubResp = readUbxBytes(fdPort, buff, &count, 2, max_ms, startTime, startTime + max_ms - currentTimeMs());
            if (isErrorReturn(rubResp))
                return makeErrorMsgReturn(ERR_CAUSE(rubResp), "couldn't read serial characters while receiving UBX message checksum");
            if (count >= 2) {
                if ((buff[0] == msg->checksum.ck_a) && (buff[1] == msg->checksum.ck_b))
                    return makeOkReturn();
                else {
                    free(msg->body);
                    return makeErrorMsgReturn(ERR_ROOT, "UBX received message with checksum error");
                }
            }
        }
        free(msg->body);
    }

    return makeErrorMsgReturn(ERR_ROOT, "timed out while waiting to receive UBX message");
}